

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::isNameValid(SelectionCompiler *this,string *name)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RSI;
  uint i;
  int ndot;
  int nbracket;
  bool local_2d;
  uint local_1c;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  for (local_1c = 0; uVar2 = std::__cxx11::string::size(), local_1c < uVar2; local_1c = local_1c + 1
      ) {
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    cVar1 = *pcVar3;
    if (cVar1 == '.') {
      local_18 = local_18 + 1;
    }
    else if (cVar1 == '[') {
      local_14 = local_14 + 1;
    }
    else if (cVar1 == ']') {
      local_14 = local_14 + -1;
    }
  }
  local_2d = local_18 < 4 && local_14 == 0;
  return (bool)(-local_2d & 1);
}

Assistant:

bool SelectionCompiler::isNameValid(const std::string& name) {
    int nbracket = 0;
    int ndot     = 0;
    for (unsigned int i = 0; i < name.size(); ++i) {
      switch (name[i]) {
      case '[':
        ++nbracket;
        break;
      case ']':
        --nbracket;
        break;
      case '.':
        ++ndot;
        break;
      }
    }

    // only allow 3 dots at most
    return (ndot <= 3 && nbracket == 0) ? true : false;
  }